

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O1

void __thiscall
glcts::ArraysOfArrays::InteractionUniforms2<glcts::ArraysOfArrays::Interface::GL>::
test_shader_compilation
          (InteractionUniforms2<glcts::ArraysOfArrays::Interface::GL> *this,
          TestShaderType tested_shader_type)

{
  long lVar1;
  long lVar2;
  long *plVar3;
  ulong *puVar4;
  undefined1 *puVar5;
  TestError *pTVar6;
  long *plVar7;
  size_type *psVar8;
  undefined1 *puVar9;
  string *psVar10;
  undefined1 *puVar11;
  int iVar12;
  undefined1 *puVar13;
  undefined1 *puVar14;
  string *psVar15;
  int sub_script_entry_index;
  int iVar16;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar17;
  bool bVar18;
  string shader_source;
  int local_18c;
  long local_188;
  long *local_178;
  long local_170;
  long local_168;
  long lStack_160;
  InteractionUniforms2<glcts::ArraysOfArrays::Interface::GL> *local_158;
  long *local_150;
  long local_148;
  long local_140;
  long lStack_138;
  string base_variable_string;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  string *local_f0;
  long local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_e0;
  string array_initializers [5];
  
  array_initializers[0]._M_dataplus._M_p = (pointer)&array_initializers[0].field_2;
  local_158 = this;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)array_initializers,
             "int[2][2][2][2](\n    int[2][2][2](\n        int[2][2](\n            int[2]( 1,  2),\n            int[2]( 3,  4)\n        ),\n        int[2][2](\n            int[2]( 5,  6),\n            int[2]( 7,  8)\n        )\n    ),\n    int[2][2][2](\n        int[2][2](\n            int[2](11, 12),\n            int[2](13, 14)\n        ),\n        int[2][2](\n            int[2](15, 16),\n            int[2](17, 18)\n        )\n    )\n)"
             ,"");
  array_initializers[1]._M_dataplus._M_p = (pointer)&array_initializers[1].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(array_initializers + 1),
             "float[2][2][2][2](\n    float[2][2][2](\n        float[2][2](\n            float[2](1.0, 2.0),\n            float[2](3.0, 4.0)),\n        float[2][2](\n            float[2](5.0, 6.0),\n            float[2](7.0, 8.0))),\n    float[2][2][2](\n        float[2][2](\n            float[2](1.1, 2.1),\n            float[2](3.1, 4.1)\n        ),\n        float[2][2](\n            float[2](5.1, 6.1),\n            float[2](7.1, 8.1)\n        )\n    )\n)"
             ,"");
  array_initializers[2]._M_dataplus._M_p = (pointer)&array_initializers[2].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(array_initializers + 2),
             "mat4[2][2][2][2](\n    mat4[2][2][2](\n        mat4[2][2](\n            mat4[2]( mat4(1),  mat4(2)),\n            mat4[2]( mat4(3),  mat4(4))\n        ),\n        mat4[2][2](\n            mat4[2](mat4(5),  mat4(6)),\n            mat4[2](mat4(7),  mat4(8))\n        )\n    ),\n    mat4[2][2][2](\n        mat4[2][2](\n            mat4[2](mat4(9),  mat4(10)),\n            mat4[2](mat4(11),  mat4(12))\n        ),\n        mat4[2][2](\n            mat4[2](mat4(13),  mat4(14)),\n            mat4[2](mat4(15),  mat4(16))\n        )\n    )\n)"
             ,"");
  array_initializers[3]._M_dataplus._M_p = (pointer)&array_initializers[3].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(array_initializers + 3),
             "double[2][2][2][2](\n    double[2][2][2](\n        double[2][2](\n            double[2](1.0, 2.0),\n            double[2](3.0, 4.0)),\n        double[2][2](\n            double[2](5.0, 6.0),\n            double[2](7.0, 8.0))),\n    double[2][2][2](\n        double[2][2](\n            double[2](1.1, 2.1),\n            double[2](3.1, 4.1)\n        ),\n        double[2][2](\n            double[2](5.1, 6.1),\n            double[2](7.1, 8.1)\n        )\n    )\n)"
             ,"");
  array_initializers[4]._M_dataplus._M_p = (pointer)&array_initializers[4].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(array_initializers + 4),
             "dmat4[2][2][2][2](\n    dmat4[2][2][2](\n        dmat4[2][2](\n            dmat4[2]( dmat4(1),  dmat4(2)),\n            dmat4[2]( dmat4(3),  dmat4(4))\n        ),\n        dmat4[2][2](\n            dmat4[2](dmat4(5),  dmat4(6)),\n            dmat4[2](dmat4(7),  dmat4(8))\n        )\n    ),\n    dmat4[2][2][2](\n        dmat4[2][2](\n            dmat4[2](dmat4(9),   dmat4(10)),\n            dmat4[2](dmat4(11),  dmat4(12))\n        ),\n        dmat4[2][2](\n            dmat4[2](dmat4(13),  dmat4(14)),\n            dmat4[2](dmat4(15),  dmat4(16))\n        )\n    )\n)"
             ,"");
  local_188 = 0;
  do {
    lVar1 = 0x2238c78;
    if (supported_variable_types_map._16_8_ != 0) {
      lVar1 = 0x2238c78;
      lVar2 = supported_variable_types_map._16_8_;
      do {
        if ((int)test_shader_compilation::var_types_set_gl[local_188] <= *(int *)(lVar2 + 0x20)) {
          lVar1 = lVar2;
        }
        lVar2 = *(long *)(lVar2 + 0x10 +
                         (ulong)(*(int *)(lVar2 + 0x20) <
                                (int)test_shader_compilation::var_types_set_gl[local_188]) * 8);
      } while (lVar2 != 0);
    }
    lVar2 = 0x2238c78;
    if ((lVar1 != 0x2238c78) &&
       (lVar2 = lVar1,
       (int)test_shader_compilation::var_types_set_gl[local_188] < *(int *)(lVar1 + 0x20))) {
      lVar2 = 0x2238c78;
    }
    if (lVar2 == 0x2238c78) {
      pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar6,"Type not found.",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,0x1ab4);
      __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    base_variable_string._M_string_length = 0;
    base_variable_string.field_2._M_local_buf[0] = '\0';
    local_e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(lVar2 + 0x48);
    local_f0 = array_initializers + local_188;
    local_18c = 1;
    base_variable_string._M_dataplus._M_p = (pointer)&base_variable_string.field_2;
    local_e8 = lVar2;
    do {
      iVar12 = 0xe;
      do {
        std::operator+(&local_110,"uniform ",local_e0);
        plVar3 = (long *)std::__cxx11::string::append((char *)&local_110);
        plVar7 = plVar3 + 2;
        if ((long *)*plVar3 == plVar7) {
          local_168 = *plVar7;
          lStack_160 = plVar3[3];
          local_178 = &local_168;
        }
        else {
          local_168 = *plVar7;
          local_178 = (long *)*plVar3;
        }
        local_170 = plVar3[1];
        *plVar3 = (long)plVar7;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        plVar3 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_178,*(ulong *)(local_e8 + 0x28));
        local_150 = &local_140;
        plVar7 = plVar3 + 2;
        if ((long *)*plVar3 == plVar7) {
          local_140 = *plVar7;
          lStack_138 = plVar3[3];
        }
        else {
          local_140 = *plVar7;
          local_150 = (long *)*plVar3;
        }
        local_148 = plVar3[1];
        *plVar3 = (long)plVar7;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        plVar3 = (long *)std::__cxx11::string::append((char *)&local_150);
        psVar8 = (size_type *)(plVar3 + 2);
        if ((size_type *)*plVar3 == psVar8) {
          shader_source.field_2._M_allocated_capacity = *psVar8;
          shader_source.field_2._8_8_ = plVar3[3];
          shader_source._M_dataplus._M_p = (pointer)&shader_source.field_2;
        }
        else {
          shader_source.field_2._M_allocated_capacity = *psVar8;
          shader_source._M_dataplus._M_p = (pointer)*plVar3;
        }
        shader_source._M_string_length = plVar3[1];
        *plVar3 = (long)psVar8;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        std::__cxx11::string::operator=((string *)&base_variable_string,(string *)&shader_source);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)shader_source._M_dataplus._M_p != &shader_source.field_2) {
          operator_delete(shader_source._M_dataplus._M_p,
                          shader_source.field_2._M_allocated_capacity + 1);
        }
        if (local_150 != &local_140) {
          operator_delete(local_150,local_140 + 1);
        }
        if (local_178 != &local_168) {
          operator_delete(local_178,local_168 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p != &local_110.field_2) {
          operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
        }
        iVar16 = 3;
        do {
          std::__cxx11::string::append((char *)&base_variable_string);
          bVar18 = iVar16 != 0;
          iVar16 = iVar16 + -1;
        } while (bVar18);
        if (local_18c == 0) {
          std::operator+(&shader_source," = ",local_f0);
          std::__cxx11::string::_M_append
                    ((char *)&base_variable_string,(ulong)shader_source._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)shader_source._M_dataplus._M_p != &shader_source.field_2) {
            operator_delete(shader_source._M_dataplus._M_p,
                            shader_source.field_2._M_allocated_capacity + 1);
          }
        }
        std::__cxx11::string::append((char *)&base_variable_string);
        std::operator+(&shader_source,&base_variable_string,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &shader_start_abi_cxx11_);
        if (TESSELATION_EVALUATION_SHADER_TYPE < tested_shader_type) {
          pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar6,"Unrecognized shader type.",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                     ,0x1aa1);
          __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
        }
        puVar4 = &set_tesseation_abi_cxx11_;
        switch(tested_shader_type) {
        case VERTEX_SHADER_TYPE:
          std::__cxx11::string::append((char *)&shader_source);
          break;
        case GEOMETRY_SHADER_TYPE:
          puVar4 = &emit_quad_abi_cxx11_;
        case TESSELATION_CONTROL_SHADER_TYPE:
          std::__cxx11::string::_M_append((char *)&shader_source,*puVar4);
        }
        std::__cxx11::string::_M_append((char *)&shader_source,shader_end_abi_cxx11_);
        if (local_18c != 0 && iVar12 != 7) {
          (*(local_158->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.
            super_TestNode._vptr_TestNode[8])(local_158,(ulong)tested_shader_type,&shader_source);
          goto LAB_00b761c3;
        }
        if (TESSELATION_EVALUATION_SHADER_TYPE < tested_shader_type) {
          pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar6,"Invalid enum",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                     ,0x1aae);
          __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
        }
        psVar10 = &shader_source;
        puVar13 = empty_string_abi_cxx11_;
        puVar11 = empty_string_abi_cxx11_;
        puVar9 = empty_string_abi_cxx11_;
        puVar5 = (undefined1 *)psVar10;
        puVar14 = empty_string_abi_cxx11_;
        psVar15 = (string *)empty_string_abi_cxx11_;
        switch(tested_shader_type) {
        case FRAGMENT_SHADER_TYPE:
          puVar5 = empty_string_abi_cxx11_;
          puVar13 = default_vertex_shader_source_abi_cxx11_;
          puVar11 = default_tc_shader_source_abi_cxx11_;
          puVar9 = (undefined1 *)&default_te_shader_source_abi_cxx11_;
          puVar14 = default_geometry_shader_source_abi_cxx11_;
          psVar15 = psVar10;
          break;
        case VERTEX_SHADER_TYPE:
          puVar11 = default_tc_shader_source_abi_cxx11_;
          puVar13 = (undefined1 *)psVar10;
          goto LAB_00b7615f;
        case GEOMETRY_SHADER_TYPE:
          puVar13 = default_vertex_shader_source_abi_cxx11_;
          puVar11 = default_tc_shader_source_abi_cxx11_;
          puVar9 = (undefined1 *)&default_te_shader_source_abi_cxx11_;
          goto LAB_00b761a0;
        case TESSELATION_CONTROL_SHADER_TYPE:
          puVar11 = (undefined1 *)psVar10;
          puVar13 = default_vertex_shader_source_abi_cxx11_;
LAB_00b7615f:
          psVar10 = (string *)&default_te_shader_source_abi_cxx11_;
LAB_00b76199:
          puVar9 = (undefined1 *)psVar10;
          psVar10 = (string *)default_geometry_shader_source_abi_cxx11_;
LAB_00b761a0:
          puVar5 = empty_string_abi_cxx11_;
          puVar14 = (undefined1 *)psVar10;
          psVar15 = (string *)default_fragment_shader_source_abi_cxx11_;
          break;
        case TESSELATION_EVALUATION_SHADER_TYPE:
          puVar13 = default_vertex_shader_source_abi_cxx11_;
          puVar11 = default_tc_shader_source_abi_cxx11_;
          goto LAB_00b76199;
        }
        (*(local_158->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.
          super_TestNode._vptr_TestNode[10])
                  (local_158,puVar13,puVar11,puVar9,puVar14,psVar15,puVar5,1,0);
LAB_00b761c3:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)shader_source._M_dataplus._M_p != &shader_source.field_2) {
          operator_delete(shader_source._M_dataplus._M_p,
                          shader_source.field_2._M_allocated_capacity + 1);
        }
        bVar18 = iVar12 != 0;
        iVar12 = iVar12 + -1;
      } while (bVar18);
      bVar18 = local_18c != 0;
      local_18c = local_18c + -1;
    } while (bVar18);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)base_variable_string._M_dataplus._M_p != &base_variable_string.field_2) {
      operator_delete(base_variable_string._M_dataplus._M_p,
                      CONCAT71(base_variable_string.field_2._M_allocated_capacity._1_7_,
                               base_variable_string.field_2._M_local_buf[0]) + 1);
    }
    local_188 = local_188 + 1;
    if (local_188 == 5) {
      lVar1 = -0xa0;
      paVar17 = &array_initializers[4].field_2;
      do {
        plVar3 = (long *)(((string *)(paVar17 + -1))->_M_dataplus)._M_p;
        if (paVar17 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)plVar3) {
          operator_delete(plVar3,paVar17->_M_allocated_capacity + 1);
        }
        paVar17 = paVar17 + -2;
        lVar1 = lVar1 + 0x20;
      } while (lVar1 != 0);
      return;
    }
  } while( true );
}

Assistant:

void InteractionUniforms2<API>::test_shader_compilation(typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	static const glcts::test_var_type var_types_set_es[] = { VAR_TYPE_INT, VAR_TYPE_FLOAT, VAR_TYPE_MAT4 };
	static const size_t				  num_var_types_es   = sizeof(var_types_set_es) / sizeof(var_types_set_es[0]);

	static const glcts::test_var_type var_types_set_gl[] = { VAR_TYPE_INT, VAR_TYPE_FLOAT, VAR_TYPE_MAT4,
															 VAR_TYPE_DOUBLE, VAR_TYPE_DMAT4 };
	static const size_t num_var_types_gl = sizeof(var_types_set_gl) / sizeof(var_types_set_gl[0]);

	const std::string array_initializers[] = { "int[2][2][2][2](\n"
											   "    int[2][2][2](\n"
											   "        int[2][2](\n"
											   "            int[2]( 1,  2),\n"
											   "            int[2]( 3,  4)\n"
											   "        ),\n"
											   "        int[2][2](\n"
											   "            int[2]( 5,  6),\n"
											   "            int[2]( 7,  8)\n"
											   "        )\n"
											   "    ),\n"
											   "    int[2][2][2](\n"
											   "        int[2][2](\n"
											   "            int[2](11, 12),\n"
											   "            int[2](13, 14)\n"
											   "        ),\n"
											   "        int[2][2](\n"
											   "            int[2](15, 16),\n"
											   "            int[2](17, 18)\n"
											   "        )\n"
											   "    )\n"
											   ")",

											   "float[2][2][2][2](\n"
											   "    float[2][2][2](\n"
											   "        float[2][2](\n"
											   "            float[2](1.0, 2.0),\n"
											   "            float[2](3.0, 4.0)),\n"
											   "        float[2][2](\n"
											   "            float[2](5.0, 6.0),\n"
											   "            float[2](7.0, 8.0))),\n"
											   "    float[2][2][2](\n"
											   "        float[2][2](\n"
											   "            float[2](1.1, 2.1),\n"
											   "            float[2](3.1, 4.1)\n"
											   "        ),\n"
											   "        float[2][2](\n"
											   "            float[2](5.1, 6.1),\n"
											   "            float[2](7.1, 8.1)\n"
											   "        )\n"
											   "    )\n"
											   ")",

											   "mat4[2][2][2][2](\n"
											   "    mat4[2][2][2](\n"
											   "        mat4[2][2](\n"
											   "            mat4[2]( mat4(1),  mat4(2)),\n"
											   "            mat4[2]( mat4(3),  mat4(4))\n"
											   "        ),\n"
											   "        mat4[2][2](\n"
											   "            mat4[2](mat4(5),  mat4(6)),\n"
											   "            mat4[2](mat4(7),  mat4(8))\n"
											   "        )\n"
											   "    ),\n"
											   "    mat4[2][2][2](\n"
											   "        mat4[2][2](\n"
											   "            mat4[2](mat4(9),  mat4(10)),\n"
											   "            mat4[2](mat4(11),  mat4(12))\n"
											   "        ),\n"
											   "        mat4[2][2](\n"
											   "            mat4[2](mat4(13),  mat4(14)),\n"
											   "            mat4[2](mat4(15),  mat4(16))\n"
											   "        )\n"
											   "    )\n"
											   ")",

											   "double[2][2][2][2](\n"
											   "    double[2][2][2](\n"
											   "        double[2][2](\n"
											   "            double[2](1.0, 2.0),\n"
											   "            double[2](3.0, 4.0)),\n"
											   "        double[2][2](\n"
											   "            double[2](5.0, 6.0),\n"
											   "            double[2](7.0, 8.0))),\n"
											   "    double[2][2][2](\n"
											   "        double[2][2](\n"
											   "            double[2](1.1, 2.1),\n"
											   "            double[2](3.1, 4.1)\n"
											   "        ),\n"
											   "        double[2][2](\n"
											   "            double[2](5.1, 6.1),\n"
											   "            double[2](7.1, 8.1)\n"
											   "        )\n"
											   "    )\n"
											   ")",

											   "dmat4[2][2][2][2](\n"
											   "    dmat4[2][2][2](\n"
											   "        dmat4[2][2](\n"
											   "            dmat4[2]( dmat4(1),  dmat4(2)),\n"
											   "            dmat4[2]( dmat4(3),  dmat4(4))\n"
											   "        ),\n"
											   "        dmat4[2][2](\n"
											   "            dmat4[2](dmat4(5),  dmat4(6)),\n"
											   "            dmat4[2](dmat4(7),  dmat4(8))\n"
											   "        )\n"
											   "    ),\n"
											   "    dmat4[2][2][2](\n"
											   "        dmat4[2][2](\n"
											   "            dmat4[2](dmat4(9),   dmat4(10)),\n"
											   "            dmat4[2](dmat4(11),  dmat4(12))\n"
											   "        ),\n"
											   "        dmat4[2][2](\n"
											   "            dmat4[2](dmat4(13),  dmat4(14)),\n"
											   "            dmat4[2](dmat4(15),  dmat4(16))\n"
											   "        )\n"
											   "    )\n"
											   ")" };

	const glcts::test_var_type* var_types_set = var_types_set_es;
	size_t						num_var_types = num_var_types_es;

	if (API::USE_DOUBLE)
	{
		var_types_set = var_types_set_gl;
		num_var_types = num_var_types_gl;
	}

	for (size_t var_type_index = 0; var_type_index < num_var_types; var_type_index++)
	{
		_supported_variable_types_map_const_iterator var_iterator =
			supported_variable_types_map.find(var_types_set[var_type_index]);

		if (var_iterator != supported_variable_types_map.end())
		{
			std::string base_variable_string;

			for (int initialiser_selector = 1; initialiser_selector >= 0; initialiser_selector--)
			{
				// We normally do all 16 possible permutations of [4][4][4][4] items (15..0).
				// However, in this case we will skip the case that will work,
				// so we'll merely process permutations 14..0
				for (int permutation_index = 14; permutation_index >= 0; permutation_index--)
				{
					base_variable_string =
						"uniform " + var_iterator->second.precision + " " + var_iterator->second.type + " x";

					// for all 4 possible sub_script entries
					for (int sub_script_entry_index = 3; sub_script_entry_index >= 0; sub_script_entry_index--)
					{
						if (permutation_index & (1 << sub_script_entry_index))
						{
							// In this case, we'll use a valid sub_script
							base_variable_string += "[2]";
						}
						else
						{
							// In this case, we'll use an invalid sub_script
							base_variable_string += "[]";
						}
					}

					if (initialiser_selector == 0)
					{
						// We'll use an initialiser
						base_variable_string += " = " + array_initializers[var_type_index];
					}

					base_variable_string += ";\n\n";

					std::string shader_source = base_variable_string + shader_start;

					/* End main */
					DEFAULT_MAIN_ENDING(tested_shader_type, shader_source);

					/* Execute test:
					 *
					 * This will succeed in case of allowed unsized
					 * declarations and when at least one of these is
					 * true:
					 *   1. There is an initialiser.
					 *   2. Only the outermost dimension is unsized,
					 *      as in [][2][2][2].
					 */
					EXECUTE_SHADER_TEST(API::ALLOW_UNSIZED_DECLARATION &&
											(initialiser_selector == 0 || permutation_index == 7),
										tested_shader_type, shader_source);
				} /* for (int permutation_index = 14; ...) */
			}	 /* for (int initialiser_selector  = 1; ...) */
		}		  /* if var_type iterator found */
		else
		{
			TCU_FAIL("Type not found.");
		}
	} /* for (int var_type_index = 0; ...) */
}